

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O2

char * Saig_ObjName(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *__format;
  
  uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
  if ((uVar3 & 7) - 7 < 0xfffffffe) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if ((uVar3 & 7) == 2) {
      iVar2 = Aig_ObjCioId(pObj);
      if (iVar2 < p->nTruePis) {
        uVar1 = Abc_Base10Log(p->nTruePis);
        uVar3 = Aig_ObjCioId(pObj);
        __format = "pi%0*d";
        goto LAB_00593928;
      }
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    }
    else if ((uVar3 & 7) == 1) goto LAB_00593804;
    if ((uVar3 & 7) == 3) {
      iVar2 = Aig_ObjCioId(pObj);
      if (iVar2 < p->nTruePos) {
        uVar1 = Abc_Base10Log(p->nTruePos);
        uVar3 = Aig_ObjCioId(pObj);
        __format = "po%0*d";
        goto LAB_00593928;
      }
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    }
    if ((uVar3 & 7) == 2) {
      iVar2 = Aig_ObjCioId(pObj);
      if (p->nTruePis <= iVar2) {
        uVar1 = Abc_Base10Log(p->nRegs);
        iVar2 = Aig_ObjCioId(pObj);
        uVar3 = iVar2 - p->nTruePis;
        __format = "lo%0*d";
        goto LAB_00593928;
      }
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    }
    if (((uVar3 & 7) != 3) || (iVar2 = Aig_ObjCioId(pObj), iVar2 < p->nTruePos)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIoa.c"
                    ,0x3c,"char *Saig_ObjName(Aig_Man_t *, Aig_Obj_t *)");
    }
    uVar1 = Abc_Base10Log(p->nRegs);
    iVar2 = Aig_ObjCioId(pObj);
    uVar3 = iVar2 - p->nTruePos;
    __format = "li%0*d";
  }
  else {
LAB_00593804:
    uVar1 = Abc_Base10Log(p->vObjs->nSize);
    uVar3 = pObj->Id;
    __format = "n%0*d";
  }
LAB_00593928:
  sprintf(Saig_ObjName::Buffer,__format,(ulong)uVar1,(ulong)uVar3);
  return Saig_ObjName::Buffer;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Saig_ObjName( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    static char Buffer[16];
    if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
        sprintf( Buffer, "n%0*d", Abc_Base10Log(Aig_ManObjNumMax(p)), Aig_ObjId(pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        sprintf( Buffer, "pi%0*d", Abc_Base10Log(Saig_ManPiNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsPo(p, pObj) )
        sprintf( Buffer, "po%0*d", Abc_Base10Log(Saig_ManPoNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsLo(p, pObj) )
        sprintf( Buffer, "lo%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPiNum(p) );
    else if ( Saig_ObjIsLi(p, pObj) )
        sprintf( Buffer, "li%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPoNum(p) );
    else 
        assert( 0 );
    return Buffer;
}